

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_sqsub_d_arm(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  uint32_t *qc;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar7 = desc * 8 & 0xff;
  uVar8 = uVar7 + 8;
  uVar4 = (ulong)uVar8;
  uVar5 = 0;
  bVar3 = 0;
  do {
    bVar2 = bVar3;
    uVar9 = *(ulong *)((long)vn + uVar5 * 8);
    uVar1 = *(ulong *)((long)vm + uVar5 * 8);
    uVar6 = uVar9 - uVar1;
    uVar10 = 0x8000000000000000;
    if (-1 < (long)uVar9) {
      uVar10 = 0x7fffffffffffffff;
    }
    bVar11 = (long)((uVar6 ^ uVar9) & (uVar1 ^ uVar9)) < 0;
    if (!bVar11) {
      uVar10 = uVar6;
    }
    *(ulong *)((long)vd + uVar5 * 8) = uVar10;
    uVar5 = uVar5 + 1;
    bVar3 = bVar2 | bVar11;
  } while (uVar8 >> 3 != uVar5);
  if ((bool)(bVar2 | bVar11)) {
    *(undefined4 *)vq = 1;
  }
  uVar8 = desc >> 2 & 0xf8;
  if (uVar7 < uVar8) {
    uVar9 = (ulong)(uVar8 + 8);
    uVar5 = uVar4 + 8;
    if (uVar4 + 8 < uVar9) {
      uVar5 = uVar9;
    }
    memset((void *)((long)vd + uVar4),0,(~uVar4 + uVar5 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sqsub_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        int64_t nn = n[i], mm = m[i], dd = nn - mm;
        if (((dd ^ nn) & (nn ^ mm)) & INT64_MIN) {
            dd = (nn >> 63) ^ ~INT64_MIN;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}